

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<capnp::word_const*&>(String *__return_storage_ptr__,kj *this,word **params)

{
  kj *this_00;
  word **value;
  CappedArray<char,_17UL> *params_00;
  CappedArray<char,_17UL> local_38;
  kj *local_18;
  word **params_local;
  
  local_18 = this;
  params_local = (word **)__return_storage_ptr__;
  this_00 = (kj *)fwd<capnp::word_const*&>((word **)this);
  toCharSequence<capnp::word_const*&>(&local_38,this_00,value);
  _::concat<kj::CappedArray<char,17ul>>(__return_storage_ptr__,(_ *)&local_38,params_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}